

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

void __thiscall HighsDomain::changeBound(HighsDomain *this,HighsDomainChange boundchg,Reason reason)

{
  HighsDomain *pHVar1;
  double dVar2;
  bool bVar3;
  reference pvVar4;
  pointer pHVar5;
  Reason RVar6;
  reference pvVar7;
  int in_EDX;
  undefined8 in_RSI;
  size_type sVar8;
  HighsDomain *in_RDI;
  HighsDomain *in_XMM0_Qa;
  double dVar9;
  double oldbound;
  bool binary;
  HighsInt prevPos;
  undefined4 in_stack_ffffffffffffff38;
  HighsInt in_stack_ffffffffffffff3c;
  HighsDomain *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  HighsInt in_stack_ffffffffffffff4c;
  HighsDomain *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  value_type in_stack_ffffffffffffff5c;
  HighsDomain *in_stack_ffffffffffffff60;
  HighsInt in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint col;
  undefined4 in_stack_ffffffffffffffc8;
  HighsInt in_stack_ffffffffffffffcc;
  HighsInt in_stack_ffffffffffffffd0;
  HighsInt in_stack_ffffffffffffffd4;
  HighsDomainChange local_10;
  
  local_10.boundtype = SUB84(in_RSI,4);
  local_10.column = (HighsInt)in_RSI;
  local_10.boundval = (double)in_XMM0_Qa;
  local_10._8_8_ = in_RSI;
  if (local_10.boundtype == kLower) {
    sVar8 = (size_type)local_10.column;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&in_RDI->col_lower_,sVar8);
    if ((double)in_XMM0_Qa <= *pvVar4) {
      if (in_EDX != -1) {
        return;
      }
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->col_lower_,(long)local_10.column);
      local_10.boundval = *pvVar4;
    }
    dVar9 = local_10.boundval;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->col_upper_,(long)local_10.column);
    dVar2 = local_10.boundval;
    if (*pvVar4 <= dVar9 && dVar9 != *pvVar4) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->col_upper_,(long)local_10.column);
      dVar9 = *pvVar4;
      pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x5bc9fb);
      if (dVar2 - dVar9 < pHVar5->feastol || dVar2 - dVar9 == pHVar5->feastol) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->col_upper_,(long)local_10.column);
        pHVar1 = (HighsDomain *)*pvVar4;
        local_10.boundval = (double)pHVar1;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->col_lower_,(long)local_10.column);
        if (((double)pHVar1 == *pvVar4) && (!NAN((double)pHVar1) && !NAN(*pvVar4))) {
          return;
        }
      }
      else {
        pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                 operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             *)0x5bca27);
        HighsDebugSol::nodePruned((HighsDebugSol *)&pHVar5->field_0x68b0,in_RDI);
        if ((in_RDI->infeasible_ & 1U) == 0) {
          sVar8 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::size
                            (&in_RDI->domchgstack_);
          in_RDI->infeasible_pos = (HighsInt)sVar8;
          in_RDI->infeasible_ = true;
          sVar8 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::size
                            (&in_RDI->domchgstack_);
          RVar6 = Reason::conflictingBounds((HighsInt)sVar8);
          in_stack_ffffffffffffffd4 = RVar6.type;
          in_RDI->infeasible_reason = RVar6;
        }
      }
    }
    std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->colLowerPos_,(long)local_10.column);
    sVar8 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::size
                      (&in_RDI->domchgstack_);
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&in_RDI->colLowerPos_,(long)local_10.column);
    *pvVar7 = (value_type)sVar8;
  }
  else {
    sVar8 = (size_type)local_10.column;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&in_RDI->col_upper_,sVar8);
    if (*pvVar4 <= (double)in_XMM0_Qa) {
      if (in_EDX != -1) {
        return;
      }
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->col_upper_,(long)local_10.column);
      local_10.boundval = *pvVar4;
    }
    dVar9 = local_10.boundval;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->col_lower_,(long)local_10.column);
    if (dVar9 < *pvVar4) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->col_lower_,(long)local_10.column);
      dVar9 = *pvVar4 - local_10.boundval;
      pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x5bcc43);
      if (dVar9 < pHVar5->feastol || dVar9 == pHVar5->feastol) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->col_lower_,(long)local_10.column);
        in_stack_ffffffffffffff60 = (HighsDomain *)*pvVar4;
        local_10.boundval = (double)in_stack_ffffffffffffff60;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->col_upper_,(long)local_10.column);
        if (((double)in_stack_ffffffffffffff60 == *pvVar4) &&
           (!NAN((double)in_stack_ffffffffffffff60) && !NAN(*pvVar4))) {
          return;
        }
      }
      else {
        pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                 operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             *)0x5bcc6f);
        HighsDebugSol::nodePruned((HighsDebugSol *)&pHVar5->field_0x68b0,in_RDI);
        if ((in_RDI->infeasible_ & 1U) == 0) {
          sVar8 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::size
                            (&in_RDI->domchgstack_);
          in_RDI->infeasible_pos = (HighsInt)sVar8;
          in_RDI->infeasible_ = true;
          sVar8 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::size
                            (&in_RDI->domchgstack_);
          RVar6 = Reason::conflictingBounds((HighsInt)sVar8);
          in_stack_ffffffffffffffcc = RVar6.type;
          in_stack_ffffffffffffffd0 = RVar6.index;
          in_RDI->infeasible_reason = RVar6;
        }
      }
    }
    std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->colUpperPos_,(long)local_10.column);
    sVar8 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::size
                      (&in_RDI->domchgstack_);
    in_stack_ffffffffffffff5c = (value_type)sVar8;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&in_RDI->colUpperPos_,(long)local_10.column);
    *pvVar7 = in_stack_ffffffffffffff5c;
  }
  pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x5bcdb2);
  HighsDebugSol::boundChangeAdded
            ((HighsDebugSol *)&pHVar5->field_0x68b0,in_RDI,&local_10,in_EDX == -1);
  if (in_EDX == -1) {
    in_stack_ffffffffffffff50 = (HighsDomain *)&in_RDI->branchPos_;
    sVar8 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::size
                      (&in_RDI->domchgstack_);
    in_stack_ffffffffffffffc8 = (undefined4)sVar8;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff40,
               (value_type_conflict2 *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)
              );
  }
  bVar3 = isBinary(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  col = CONCAT13(bVar3,(int3)in_stack_ffffffffffffffc4);
  doChangeBound(in_stack_ffffffffffffff60,
                (HighsDomainChange *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
  emplace_back<double&,int&>
            ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
             in_stack_ffffffffffffff50,
             (double *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
             (int *)in_stack_ffffffffffffff40);
  std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::push_back
            ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)
             in_stack_ffffffffffffff50,
             (value_type *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  std::vector<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>::push_back
            ((vector<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_> *)
             in_stack_ffffffffffffff50,
             (value_type *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  if ((((col & 0x1000000) != 0) && ((in_RDI->infeasible_ & 1U) == 0)) &&
     (bVar3 = isFixed(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c), bVar3)) {
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x5bceec)
    ;
    std::vector<double,_std::allocator<double>_>::operator[]
              (&in_RDI->col_lower_,(long)local_10.column);
    HighsCliqueTable::addImplications
              ((HighsCliqueTable *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (HighsDomain *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),col,
               in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

void HighsDomain::changeBound(HighsDomainChange boundchg, Reason reason) {
  assert(boundchg.column >= 0);
  assert(boundchg.column < (HighsInt)col_upper_.size());
  // assert(infeasible_ == 0);
  // if (reason.type == Reason::kObjective) {
  //   if (!mipsolver->submip)
  //     printf("objective propagator changed %s bound of column %d to %g\n",
  //            boundchg.boundtype == HighsBoundType::kLower ? "lower" :
  //            "upper", boundchg.column, boundchg.boundval);
  // }

  HighsInt prevPos;
  if (boundchg.boundtype == HighsBoundType::kLower) {
    if (boundchg.boundval <= col_lower_[boundchg.column]) {
      if (reason.type != Reason::kBranching) return;
      boundchg.boundval = col_lower_[boundchg.column];
    }
    if (boundchg.boundval > col_upper_[boundchg.column]) {
      if (boundchg.boundval - col_upper_[boundchg.column] >
          mipsolver->mipdata_->feastol) {
        mipsolver->mipdata_->debugSolution.nodePruned(*this);
        if (!infeasible_) {
          infeasible_pos = domchgstack_.size();
          infeasible_ = true;
          infeasible_reason = Reason::conflictingBounds(domchgstack_.size());
        }
      } else {
        boundchg.boundval = col_upper_[boundchg.column];
        if (boundchg.boundval == col_lower_[boundchg.column]) return;
      }
    }

    prevPos = colLowerPos_[boundchg.column];
    colLowerPos_[boundchg.column] = domchgstack_.size();
  } else {
    if (boundchg.boundval >= col_upper_[boundchg.column]) {
      if (reason.type != Reason::kBranching) return;
      boundchg.boundval = col_upper_[boundchg.column];
    }
    if (boundchg.boundval < col_lower_[boundchg.column]) {
      if (col_lower_[boundchg.column] - boundchg.boundval >
          mipsolver->mipdata_->feastol) {
        mipsolver->mipdata_->debugSolution.nodePruned(*this);
        if (!infeasible_) {
          infeasible_pos = domchgstack_.size();
          infeasible_ = true;
          infeasible_reason = Reason::conflictingBounds(domchgstack_.size());
        }
      } else {
        boundchg.boundval = col_lower_[boundchg.column];
        if (boundchg.boundval == col_upper_[boundchg.column]) return;
      }
    }

    prevPos = colUpperPos_[boundchg.column];
    colUpperPos_[boundchg.column] = domchgstack_.size();
  }

  mipsolver->mipdata_->debugSolution.boundChangeAdded(
      *this, boundchg, reason.type == Reason::kBranching);

  if (reason.type == Reason::kBranching)
    branchPos_.push_back(domchgstack_.size());

  assert(prevPos < (HighsInt)domchgstack_.size());

  bool binary = isBinary(boundchg.column);

  double oldbound = doChangeBound(boundchg);

  prevboundval_.emplace_back(oldbound, prevPos);
  domchgstack_.push_back(boundchg);
  domchgreason_.push_back(reason);

  if (binary && !infeasible_ && isFixed(boundchg.column))
    mipsolver->mipdata_->cliquetable.addImplications(
        *this, boundchg.column, col_lower_[boundchg.column] > 0.5);
}